

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

ExprBase *
AnalyzeFunctionDefinition
          (ExpressionContext *ctx,SynFunctionDefinition *syntax,FunctionData *genericProto,
          TypeFunction *instance,TypeBase *instanceParent,IntrusiveList<MatchData> matches,
          bool createAccess,bool hideFunction,bool checkParent)

{
  bool bVar1;
  char *pcVar2;
  uint uVar3;
  int iVar4;
  TypeBase *pTVar5;
  ExprError *pEVar6;
  undefined4 extraout_var;
  ExprFunctionDefinition *definition;
  ExprBase *pEVar7;
  char *pcVar8;
  ScopeData *pSVar9;
  byte bVar10;
  bool local_45;
  
  if (instanceParent == (TypeBase *)0x0) {
    local_45 = hideFunction;
    bVar10 = 1;
    if (syntax->parentType == (SynBase *)0x0) {
      instanceParent = (TypeBase *)0x0;
      goto LAB_001eef52;
    }
    instanceParent = AnalyzeType(ctx,syntax->parentType,true,(bool *)0x0);
    if ((instanceParent == (TypeBase *)0x0) || (uVar3 = instanceParent->typeID, uVar3 == 0)) {
      instanceParent = (TypeBase *)0x0;
      goto LAB_001eef52;
    }
    pSVar9 = ctx->scope;
    if (checkParent && pSVar9 != (ScopeData *)0x0) {
      do {
        pTVar5 = pSVar9->ownerType;
        if (pTVar5 != (TypeBase *)0x0) {
          if (instanceParent != pTVar5) {
            pcVar8 = (instanceParent->name).begin;
            pcVar2 = (pTVar5->name).begin;
            anon_unknown.dwarf_1117a3::Stop
                      (ctx,&syntax->super_SynBase,
                       "ERROR: cannot define class \'%.*s\' function inside the scope of class \'%.*s\'"
                       ,(ulong)(uint)(*(int *)&(instanceParent->name).end - (int)pcVar8),pcVar8,
                       (ulong)(uint)(*(int *)&(pTVar5->name).end - (int)pcVar2),pcVar2);
          }
          syntax = (SynFunctionDefinition *)syntax->parentType;
          pcVar8 = "ERROR: class name repeated inside the definition of class";
          goto LAB_001ef122;
        }
        pSVar9 = pSVar9->scope;
      } while (pSVar9 != (ScopeData *)0x0);
    }
  }
  else {
    uVar3 = instanceParent->typeID;
  }
  bVar10 = 0;
  local_45 = hideFunction;
  if ((uVar3 < 0xf) && ((0x7002U >> (uVar3 & 0x1f) & 1) != 0)) {
    bVar1 = syntax->accessor;
    pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
    if (bVar1 == true) {
      pcVar8 = "ERROR: cannot add accessor to type \'%.*s\'";
    }
    else {
      pcVar8 = "ERROR: cannot add member function to type \'%.*s\'";
    }
    pEVar6 = anon_unknown.dwarf_1117a3::ReportExpected
                       (ctx,&syntax->super_SynBase,pTVar5,pcVar8,
                        (ulong)(uint)(*(int *)&(instanceParent->name).end -
                                     (int)(instanceParent->name).begin));
    return &pEVar6->super_ExprBase;
  }
LAB_001eef52:
  pTVar5 = AnalyzeType(ctx,syntax->returnType,true,(bool *)0x0);
  if (pTVar5->isGeneric != true) {
    if ((bVar10 & syntax->accessor) == 1) {
      iVar4 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
      definition = (ExprFunctionDefinition *)CONCAT44(extraout_var,iVar4);
      pTVar5 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
      (definition->super_ExprBase).typeID = 0;
      (definition->super_ExprBase).source = &syntax->super_SynBase;
      (definition->super_ExprBase).type = pTVar5;
      (definition->super_ExprBase).next = (ExprBase *)0x0;
      (definition->super_ExprBase).listed = false;
      (definition->super_ExprBase)._vptr_ExprBase = (_func_int **)&PTR__ExprError_003e6630;
      (definition->expressions).tail = (ExprBase *)0x0;
      definition->function = (FunctionData *)&definition->arguments;
      definition->contextArgument = (ExprVariableDefinition *)0x400000000;
    }
    else {
      definition = (ExprFunctionDefinition *)
                   CreateFunctionDefinition
                             (ctx,&syntax->super_SynBase,(bool)(syntax->super_SynBase).field_0x3a,
                              (bool)(syntax->super_SynBase).field_0x3b,instanceParent,
                              syntax->accessor,pTVar5,syntax->isOperator,syntax->name,
                              syntax->aliases,syntax->arguments,syntax->expressions,genericProto,
                              instance,matches);
      if (definition == (ExprFunctionDefinition *)0x0) {
        definition = (ExprFunctionDefinition *)0x0;
      }
      else if (((definition->super_ExprBase).typeID == 0x24) &&
              (createAccess && definition->function->scope->ownerType == (TypeBase *)0x0)) {
        pEVar7 = CreateFunctionPointer(ctx,&syntax->super_SynBase,definition,local_45);
        return pEVar7;
      }
    }
    return &definition->super_ExprBase;
  }
  pcVar8 = "ERROR: return type can\'t be generic";
LAB_001ef122:
  anon_unknown.dwarf_1117a3::Stop(ctx,&syntax->super_SynBase,pcVar8);
}

Assistant:

ExprBase* AnalyzeFunctionDefinition(ExpressionContext &ctx, SynFunctionDefinition *syntax, FunctionData *genericProto, TypeFunction *instance, TypeBase *instanceParent, IntrusiveList<MatchData> matches, bool createAccess, bool hideFunction, bool checkParent)
{
	TypeBase *parentType = NULL;

	if(instanceParent)
	{
		parentType = instanceParent;
	}
	else if(syntax->parentType)
	{
		parentType = AnalyzeType(ctx, syntax->parentType);

		if(isType<TypeError>(parentType))
			parentType = NULL;

		if(parentType && checkParent)
		{
			if(TypeBase *currentType = ctx.GetCurrentType(ctx.scope))
			{
				if(parentType == currentType)
					Stop(ctx, syntax->parentType, "ERROR: class name repeated inside the definition of class");

				Stop(ctx, syntax, "ERROR: cannot define class '%.*s' function inside the scope of class '%.*s'", FMT_ISTR(parentType->name), FMT_ISTR(currentType->name));
			}
		}
	}

	if(parentType && (isType<TypeGeneric>(parentType) || isType<TypeGenericAlias>(parentType) || isType<TypeAuto>(parentType) || isType<TypeVoid>(parentType)))
	{
		if(syntax->accessor)
			return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot add accessor to type '%.*s'", FMT_ISTR(parentType->name));

		return ReportExpected(ctx, syntax, ctx.GetErrorType(), "ERROR: cannot add member function to type '%.*s'", FMT_ISTR(parentType->name));
	}

	TypeBase *returnType = AnalyzeType(ctx, syntax->returnType);

	if(returnType->isGeneric)
		Stop(ctx, syntax, "ERROR: return type can't be generic");

	if(syntax->accessor && !parentType)
		return new (ctx.get<ExprError>()) ExprError(syntax, ctx.GetErrorType());

	ExprBase *value = CreateFunctionDefinition(ctx, syntax, syntax->prototype, syntax->coroutine, parentType, syntax->accessor, returnType, syntax->isOperator, syntax->name, syntax->aliases, syntax->arguments, syntax->expressions, genericProto, instance, matches);

	if(ExprFunctionDefinition *definition = getType<ExprFunctionDefinition>(value))
	{
		if(definition->function->scope->ownerType)
			return value;

		if(createAccess)
			return CreateFunctionPointer(ctx, syntax, definition, hideFunction);
	}

	return value;
}